

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O2

void GD::update<false,true,false,true,false,0ul,1ul,2ul>(gd *g,base_learner *param_2,example *ec)

{
  double *pdVar1;
  shared_data *psVar2;
  float update;
  
  update = compute_update<false,true,false,true,false,0ul,1ul,2ul>(g,ec);
  if ((update != 0.0) || (NAN(update))) {
    train<false,true,0ul,1ul,2ul>(g,ec,update);
  }
  psVar2 = g->all->sd;
  pdVar1 = &psVar2->contraction;
  if ((1e-09 < *pdVar1 || *pdVar1 == 1e-09) && (psVar2->gravity <= 1000.0)) {
    return;
  }
  sync_weights(g->all);
  return;
}

Assistant:

void update(gd& g, base_learner&, example& ec)
{
  // invariant: not a test label, importance weight > 0
  float update;
  if ((update = compute_update<sparse_l2, invariant, sqrt_rate, feature_mask_off, adax, adaptive, normalized, spare>(
           g, ec)) != 0.)
    train<sqrt_rate, feature_mask_off, adaptive, normalized, spare>(g, ec, update);

  if (g.all->sd->contraction < 1e-9 || g.all->sd->gravity > 1e3)  // updating weights now to avoid numerical instability
    sync_weights(*g.all);
}